

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O0

void __thiscall
TPZBlockDiagonal<float>::Print
          (TPZBlockDiagonal<float> *this,char *msg,ostream *out,MatrixOutputFormat format)

{
  long lVar1;
  int64_t iVar2;
  ostream *poVar3;
  void *pvVar4;
  int *piVar5;
  long lVar6;
  long *plVar7;
  float *pfVar8;
  int in_ECX;
  ostream *in_RDX;
  char *in_RSI;
  long in_RDI;
  int64_t c;
  int64_t r;
  int64_t pos;
  int64_t bsize;
  int64_t b;
  int64_t nblock;
  MatrixOutputFormat in_stack_0000030c;
  ostream *in_stack_00000310;
  char *in_stack_00000318;
  TPZMatrix<float> *in_stack_00000320;
  long local_50;
  long local_48;
  int64_t local_30;
  
  if (in_ECX == 0) {
    std::operator<<(in_RDX,"TPZBlockDiagonal matrix ");
    if (in_RSI != (char *)0x0) {
      std::operator<<(in_RDX,in_RSI);
    }
    std::ostream::operator<<(in_RDX,std::endl<char,std::char_traits<char>>);
    iVar2 = TPZVec<int>::NElements((TPZVec<int> *)(in_RDI + 0x60));
    poVar3 = std::operator<<(in_RDX,"Number of blocks ");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,iVar2);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    for (local_30 = 0; local_30 < iVar2; local_30 = local_30 + 1) {
      piVar5 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x60),local_30);
      lVar6 = (long)*piVar5;
      poVar3 = std::operator<<(in_RDX,"block number ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_30);
      poVar3 = std::operator<<(poVar3," size : ");
      pvVar4 = (void *)std::ostream::operator<<(poVar3,lVar6);
      std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
      plVar7 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x40),local_30);
      lVar1 = *plVar7;
      for (local_50 = 0; local_50 < lVar6; local_50 = local_50 + 1) {
        for (local_48 = 0; local_48 < lVar6; local_48 = local_48 + 1) {
          pfVar8 = TPZVec<float>::operator[]
                             ((TPZVec<float> *)(in_RDI + 0x20),lVar1 + local_48 + lVar6 * local_50);
          poVar3 = (ostream *)std::ostream::operator<<(in_RDX,*pfVar8);
          std::operator<<(poVar3,' ');
        }
        std::ostream::operator<<(in_RDX,std::endl<char,std::char_traits<char>>);
      }
    }
  }
  else {
    TPZMatrix<float>::Print(in_stack_00000320,in_stack_00000318,in_stack_00000310,in_stack_0000030c)
    ;
  }
  return;
}

Assistant:

void TPZBlockDiagonal<TVar>::Print(const char *msg, std::ostream &out, const MatrixOutputFormat format) const {
	
	if(format != EFormatted)
	{
		TPZMatrix<TVar>::Print(msg,out,format);
		return;
	}
	out << "TPZBlockDiagonal matrix ";
	if(msg) out << msg;
	out  << std::endl;
	
	int64_t nblock = fBlockSize.NElements();
	out << "Number of blocks " << nblock << std::endl; 
	int64_t b,bsize,pos;
	for(b=0; b<nblock; b++) {
		bsize = fBlockSize[b];
		out << "block number " << b << " size : " << bsize << std::endl;
		int64_t r,c;
		pos = fBlockPos[b];
		for(c=0; c<bsize; c++) {
			for(r=0; r<bsize ; r++) {
				out << fStorage[pos+r+bsize*c] << ' ';
			}
			out << std::endl;
		}
	}
}